

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void secp256k1_musig_partial_sign_clear(secp256k1_scalar *sk,secp256k1_scalar *k)

{
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  
  sk->d[2] = 0;
  sk->d[3] = 0;
  sk->d[0] = 0;
  sk->d[1] = 0;
  k->d[2] = 0;
  k->d[3] = 0;
  k->d[0] = 0;
  k->d[1] = 0;
  k[1].d[2] = 0;
  k[1].d[3] = 0;
  k[1].d[0] = 0;
  k[1].d[1] = 0;
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_memclear(void *ptr, size_t len) {
#if defined(_MSC_VER)
    /* SecureZeroMemory is guaranteed not to be optimized out by MSVC. */
    SecureZeroMemory(ptr, len);
#elif defined(__GNUC__)
    /* We use a memory barrier that scares the compiler away from optimizing out the memset.
     *
     * Quoting Adam Langley <agl@google.com> in commit ad1907fe73334d6c696c8539646c21b11178f20f
     * in BoringSSL (ISC License):
     *    As best as we can tell, this is sufficient to break any optimisations that
     *    might try to eliminate "superfluous" memsets.
     * This method is used in memzero_explicit() the Linux kernel, too. Its advantage is that it
     * is pretty efficient, because the compiler can still implement the memset() efficiently,
     * just not remove it entirely. See "Dead Store Elimination (Still) Considered Harmful" by
     * Yang et al. (USENIX Security 2017) for more background.
     */
    memset(ptr, 0, len);
    __asm__ __volatile__("" : : "r"(ptr) : "memory");
#else
    void *(*volatile const volatile_memset)(void *, int, size_t) = memset;
    volatile_memset(ptr, 0, len);
#endif
#ifdef VERIFY
    SECP256K1_CHECKMEM_UNDEFINE(ptr, len);
#endif
}